

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

void DoRemove(AActor *removetarget,int flags,PClassActor *filter,FName *species)

{
  int iVar1;
  undefined4 extraout_var;
  byte bVar3;
  bool bVar4;
  FName actorSpecies;
  int local_2c;
  PClassActor *pPVar2;
  
  pPVar2 = (PClassActor *)(removetarget->super_DThinker).super_DObject.Class;
  if (pPVar2 == (PClassActor *)0x0) {
    iVar1 = (**(removetarget->super_DThinker).super_DObject._vptr_DObject)(removetarget);
    pPVar2 = (PClassActor *)CONCAT44(extraout_var,iVar1);
    (removetarget->super_DThinker).super_DObject.Class = (PClass *)pPVar2;
  }
  iVar1 = species->Index;
  AActor::GetSpecies((AActor *)&stack0xffffffffffffffd4);
  if (iVar1 == 0) {
    bVar4 = true;
  }
  else if ((flags & 0x20U) == 0) {
    bVar4 = local_2c == iVar1;
  }
  else {
    bVar4 = local_2c != iVar1;
  }
  bVar3 = filter == (PClassActor *)0x0 | pPVar2 == filter ^ (byte)((flags & 0x10U) >> 4);
  if ((flags & 0x40U) == 0) {
    if ((bVar3 & bVar4) != 1) {
      return;
    }
  }
  else if (bVar3 == 0 && bVar4 == false) {
    return;
  }
  if ((flags & 8U) != 0) {
    P_RemoveThing(removetarget);
  }
  if (((flags & 4U) != 0) &&
     ((((removetarget->flags3).Value & 0x2000) == 0 ||
      (((removetarget->flags).Value & 0x10000) == 0)))) {
    P_RemoveThing(removetarget);
  }
  if (((flags & 2U) == 0) && (((removetarget->flags3).Value & 0x2000) != 0)) {
    P_RemoveThing(removetarget);
  }
  if (((flags & 1U) != 0) && (((removetarget->flags).Value & 0x10000) != 0)) {
    P_RemoveThing(removetarget);
  }
  return;
}

Assistant:

static void DoRemove(AActor *removetarget, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(removetarget, filter, !!(flags & RMVF_EXFILTER)),
		speciespass = DoCheckSpecies(removetarget, species, !!(flags & RMVF_EXSPECIES));
	if ((flags & RMVF_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass))
	{
		if ((flags & RMVF_EVERYTHING))
		{
			P_RemoveThing(removetarget);
		}
		if ((flags & RMVF_MISC) && !((removetarget->flags3 & MF3_ISMONSTER) && (removetarget->flags & MF_MISSILE)))
		{
			P_RemoveThing(removetarget);
		}
		if ((removetarget->flags3 & MF3_ISMONSTER) && !(flags & RMVF_NOMONSTERS))
		{
			P_RemoveThing(removetarget);
		}
		if ((removetarget->flags & MF_MISSILE) && (flags & RMVF_MISSILES))
		{
			P_RemoveThing(removetarget);
		}
	}
}